

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

qint64 __thiscall
QSocks5SocketEngine::writeDatagram
          (QSocks5SocketEngine *this,char *data,qint64 len,QIpPacketHeader *header)

{
  bool bVar1;
  SocketError SVar2;
  QSocks5SocketEnginePrivate *pQVar3;
  QAbstractSocketEngine *this_00;
  QAbstractSocketEngine *pQVar4;
  longlong in_RDX;
  char *in_RSI;
  QUdpSocket *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QSocks5SocketEnginePrivate *d;
  QByteArray sealedBuf;
  QByteArray outBuf;
  QByteArray *in_stack_fffffffffffffee8;
  QString *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  undefined2 uVar5;
  quint16 in_stack_fffffffffffffefe;
  undefined2 uVar6;
  QString *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  byte in_stack_ffffffffffffff0f;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff58;
  Socks5Mode socks5Mode;
  QSocks5SocketEnginePrivate *in_stack_ffffffffffffff60;
  undefined1 local_88 [24];
  QByteArray local_70;
  QByteArray local_58;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 local_10 [8];
  long local_8;
  
  socks5Mode = (Socks5Mode)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QSocks5SocketEngine *)0x37469f);
  if (pQVar3->data == (QSocks5Data *)0x0) {
    QSocks5SocketEnginePrivate::initialize(in_stack_ffffffffffffff60,socks5Mode);
    latin1 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT26(in_stack_fffffffffffffefe,
                                         CONCAT24(in_stack_fffffffffffffefc,
                                                  in_stack_fffffffffffffef8)),
                        (size_t)in_stack_fffffffffffffef0);
    QString::QString(in_stack_ffffffffffffff00,latin1);
    QHostAddress::QHostAddress
              ((QHostAddress *)in_stack_ffffffffffffff00,
               (QString *)
               CONCAT26(in_stack_fffffffffffffefe,
                        CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
    in_stack_ffffffffffffff0f =
         (**(code **)(*(long *)&in_RDI->super_QAbstractSocket + 0x90))(in_RDI,local_10,0);
    in_stack_ffffffffffffff0f = in_stack_ffffffffffffff0f ^ 0xff;
    QHostAddress::~QHostAddress((QHostAddress *)0x374738);
    QString::~QString((QString *)0x374745);
    if ((in_stack_ffffffffffffff0f & 1) != 0) {
      in_RDX = -1;
      goto LAB_003749f8;
    }
  }
  local_40 = 0xaaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x374799);
  QByteArray::reserve((QByteArray *)in_stack_ffffffffffffff00,
                      CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QByteArray::append((QByteArray *)in_stack_ffffffffffffff00,
                     CONCAT26(in_stack_fffffffffffffefe,
                              CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),
                     (char)((ulong)in_stack_fffffffffffffef0 >> 0x38));
  bVar1 = qt_socks5_set_host_address_and_port
                    ((QHostAddress *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     (quint16)((ulong)in_RDI >> 0x30),
                     (QByteArray *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  if (bVar1) {
    QByteArray::QByteArray(&local_58,in_RSI,in_RDX);
    QByteArray::operator+=((QByteArray *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    QByteArray::~QByteArray((QByteArray *)0x374838);
    local_70.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_70.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_70.d.size = -0x5555555555555556;
    QByteArray::QByteArray((QByteArray *)0x374872);
    bVar1 = QSocks5Authenticator::seal
                      ((QSocks5Authenticator *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                       (QByteArray *)0x374897);
    if (bVar1) {
      this_00 = (QAbstractSocketEngine *)
                QUdpSocket::writeDatagram
                          (in_RDI,(QByteArray *)
                                  CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                           (QHostAddress *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefe);
      pQVar4 = (QAbstractSocketEngine *)QByteArray::size(&local_70);
      if (this_00 != pQVar4) {
        SVar2 = QAbstractSocket::error((QAbstractSocket *)0x374964);
        if (SVar2 == DatagramTooLargeError) {
          SVar2 = QAbstractSocket::error((QAbstractSocket *)0x37497e);
          uVar5 = (undefined2)SVar2;
          uVar6 = (undefined2)((uint)SVar2 >> 0x10);
          QIODevice::errorString();
          QAbstractSocketEngine::setError(this_00,CONCAT22(uVar6,uVar5),in_stack_fffffffffffffef0);
          QString::~QString((QString *)0x3749b9);
        }
        in_RDX = -1;
      }
    }
    else {
      (*pQVar3->data->authenticator->_vptr_QSocks5Authenticator[5])(local_88);
      QAbstractSocketEngine::setError
                ((QAbstractSocketEngine *)in_stack_ffffffffffffff00,
                 CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc),
                 in_stack_fffffffffffffef0);
      QString::~QString((QString *)0x3748dd);
      in_RDX = -1;
    }
    QByteArray::~QByteArray((QByteArray *)0x3749eb);
  }
  else {
    in_RDX = -1;
  }
  QByteArray::~QByteArray((QByteArray *)0x3749f8);
LAB_003749f8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDX;
}

Assistant:

qint64 QSocks5SocketEngine::writeDatagram(const char *data, qint64 len, const QIpPacketHeader &header)
{
#ifndef QT_NO_UDPSOCKET
    Q_D(QSocks5SocketEngine);

    // it is possible to send with out first binding with udp, but socks5 requires a bind.
    if (!d->data) {
        d->initialize(QSocks5SocketEnginePrivate::UdpAssociateMode);
        // all udp needs to be bound
        if (!bind(QHostAddress("0.0.0.0"_L1), 0)) {
            //### set error
            return -1;
        }
    }

    QByteArray outBuf;
    outBuf.reserve(270 + len);
    outBuf.append(3, '\0');
    if (!qt_socks5_set_host_address_and_port(header.destinationAddress, header.destinationPort, &outBuf)) {
        QSOCKS5_DEBUG << "error setting address" << header.destinationAddress << " : "
                      << header.destinationPort;
        //### set error code ....
        return -1;
    }
    outBuf += QByteArray(data, len);
    QSOCKS5_DEBUG << "sending" << dump(outBuf);
    QByteArray sealedBuf;
    if (!d->data->authenticator->seal(outBuf, &sealedBuf)) {
        QSOCKS5_DEBUG << "sealing data failed";
        setError(QAbstractSocket::SocketAccessError, d->data->authenticator->errorString());
        return -1;
    }
    if (d->udpData->udpSocket->writeDatagram(sealedBuf, d->udpData->associateAddress, d->udpData->associatePort) != sealedBuf.size()) {
        //### try frgamenting
        if (d->udpData->udpSocket->error() == QAbstractSocket::DatagramTooLargeError)
            setError(d->udpData->udpSocket->error(), d->udpData->udpSocket->errorString());
        //### else maybe more serious error
        return -1;
    }

    return len;
#else
    Q_UNUSED(data);
    Q_UNUSED(len);
    Q_UNUSED(header);
    return -1;
#endif // QT_NO_UDPSOCKET
}